

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_string.h
# Opt level: O3

void __thiscall cppcms::xss::details::c_string::c_string(c_string *this,string *other)

{
  pointer pcVar1;
  
  (this->container_)._M_dataplus._M_p = (pointer)&(this->container_).field_2;
  (this->container_)._M_string_length = 0;
  (this->container_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->container_);
  pcVar1 = (this->container_)._M_dataplus._M_p;
  this->begin_ = pcVar1;
  this->end_ = pcVar1 + (this->container_)._M_string_length;
  return;
}

Assistant:

explicit c_string(std::string const &other)
				{
					container_ = other;
					begin_ = container_.c_str();
					end_ = begin_ + container_.size();
				}